

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

Res __thiscall Ptex::v2_2::PtexWriterBase::calcTileRes(PtexWriterBase *this,Res faceres)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = ((1 << (faceres.ulog2 & 0x1fU)) << (faceres.vlog2 & 0x1fU)) * this->_pixelSize;
  iVar2 = iVar5 + 0xffff;
  if (-1 < iVar5) {
    iVar2 = iVar5;
  }
  uVar3 = (uint)(iVar2 >> 0x10) >> 1 | iVar2 >> 0x10;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar3 = uVar3 >> 1 | uVar3 >> 0x11;
  uVar3 = (uVar3 >> 1 & 0x15555555) + (uVar3 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x13333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
  uVar3 = (uVar3 >> 8) + uVar3;
  uVar1 = (uVar3 >> 0x10) + uVar3 & 0xff;
  uVar3 = (uint)((ushort)faceres >> 8);
  if (uVar1 != 0) {
    iVar4 = (int)faceres.ulog2;
    uVar6 = (uint)faceres.vlog2;
    iVar5 = (uVar6 + iVar4) - uVar1;
    iVar2 = (int)(short)((short)((iVar5 + 1U & 0xffff) >> 0xf) + (short)iVar5 + 1) >> 1;
    if (iVar4 <= iVar2) {
      iVar2 = iVar4;
    }
    faceres = SUB42(iVar2,0);
    uVar3 = iVar5 - (char)iVar2;
    if ((int)uVar6 <= (int)uVar3) {
      uVar3 = uVar6;
    }
  }
  return (Res)((ushort)faceres & 0xff | (ushort)((uVar3 & 0xff) << 8));
}

Assistant:

Ptex::Res PtexWriterBase::calcTileRes(Res faceres)
{
    // desired number of tiles = floor(log2(facesize / tilesize))
    int facesize = faceres.size() * _pixelSize;
    int ntileslog2 = PtexUtils::floor_log2(facesize/TileSize);
    if (ntileslog2 == 0) return faceres;

    // number of tiles is defined as:
    //   ntileslog2 = ureslog2 + vreslog2 - (tile_ureslog2 + tile_vreslog2)
    // rearranging to solve for the tile res:
    //   tile_ureslog2 + tile_vreslog2 = ureslog2 + vreslog2 - ntileslog2
    int n = faceres.ulog2 + faceres.vlog2 - ntileslog2;

    // choose u and v sizes for roughly square result (u ~= v ~= n/2)
    // and make sure tile isn't larger than face
    Res tileres;
    tileres.ulog2 = (int8_t)PtexUtils::min(int((n+1)/2), int(faceres.ulog2));
    tileres.vlog2 = (int8_t)PtexUtils::min(int(n - tileres.ulog2), int(faceres.vlog2));
    return tileres;
}